

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_test.cc
# Opt level: O0

void __thiscall
fizplex::NumericTest_StrictlyGreaterNorm_Test::TestBody(NumericTest_StrictlyGreaterNorm_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  bool *in_stack_fffffffffffffe28;
  AssertionResult *in_stack_fffffffffffffe30;
  AssertionResult *this_00;
  string local_180;
  AssertHelper local_160;
  Message local_158;
  undefined1 local_149;
  AssertionResult local_148;
  string local_138;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_101;
  AssertionResult local_100;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_b9;
  AssertionResult local_b8;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_71;
  AssertionResult local_70;
  string local_60;
  AssertHelper local_40;
  Message local_38 [3];
  undefined1 local_19;
  AssertionResult local_18;
  
  bVar1 = is_greater_norm((double)in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28);
  local_19 = !bVar1;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(type *)0x1db97b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_18,(AssertionResult *)"!is_greater_norm(-1.0, 1.0)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    testing::Message::~Message((Message *)0x1dba5c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dbad4);
  local_71 = is_greater_norm((double)in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(type *)0x1dbb09);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_70,(AssertionResult *)"is_greater_norm(1.0, 0.0)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message((Message *)0x1dbbfc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dbc74);
  bVar1 = is_greater_norm((double)in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28);
  local_b9 = !bVar1;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(type *)0x1dbcab);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_b8,(AssertionResult *)"!is_greater_norm(1.0, 1.0)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message((Message *)0x1dbd9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dbe16);
  local_101 = is_greater_norm((double)in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(type *)0x1dbe50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,(internal *)&local_100,(AssertionResult *)"is_greater_norm(21.0, -9)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    testing::Message::~Message((Message *)0x1dbf43);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dbfbb);
  bVar1 = is_greater_norm((double)in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28);
  local_149 = !bVar1;
  this_00 = &local_148;
  testing::AssertionResult::AssertionResult<bool>
            (this_00,in_stack_fffffffffffffe28,(type *)0x1dbff7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)&local_148,
               (AssertionResult *)"is_greater_norm(1000000.0011, 1000000.001)","true","false",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message((Message *)0x1dc0d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc14a);
  return;
}

Assistant:

TEST(NumericTest, StrictlyGreaterNorm) {
  EXPECT_TRUE(!is_greater_norm(-1.0, 1.0));
  EXPECT_TRUE(is_greater_norm(1.0, 0.0));
  EXPECT_TRUE(!is_greater_norm(1.0, 1.0));
  EXPECT_TRUE(is_greater_norm(21.0, -9));
  EXPECT_FALSE(is_greater_norm(1000000.0011, 1000000.001));
}